

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_function_args(FILE *out,Type_Function *func)

{
  ulong local_20;
  size_t i;
  Type_Function *func_local;
  FILE *out_local;
  
  if (func->number_of_arguments != 0) {
    print_denoted(out,(Denoted *)*func->arguments);
    for (local_20 = 1; local_20 < func->number_of_arguments; local_20 = local_20 + 1) {
      fprintf((FILE *)out,", ");
      print_denoted(out,(Denoted *)func->arguments[local_20]);
    }
  }
  return;
}

Assistant:

void print_function_args(FILE *out,struct Type_Function *func)
{
	size_t i;
	if(func->number_of_arguments==0)
		return;

	print_denoted(out,(struct Denoted*)func->arguments[0]);
	for(i=1;i<func->number_of_arguments;++i)
	{
		fprintf(out,", ");
		print_denoted(out,(struct Denoted*)func->arguments[i]);
	}	
}